

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* getEvents_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,Session *session,char *eventFormat)

{
  Result *in_R9;
  TestStream stream;
  ConsumeResult cr;
  ExpressionDecomposer local_94;
  TestStream local_90;
  Result local_68;
  Expression_lhs<unsigned_long> local_48;
  ConsumeResult local_38;
  
  local_90.super_EntryStream._vptr_EntryStream = (_func_int **)&PTR__TestStream_001ebca8;
  local_90.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_90.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_90.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_90.readPos = 0;
  binlog::Session::consume<TestStream>(&local_38,session,&local_90);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_94,DT_CHECK);
  local_48.lhs = (long)local_90.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_90.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
  local_48.m_at = local_94.m_at;
  doctest::detail::Expression_lhs<unsigned_long>::operator==
            (&local_68,&local_48,&local_38.bytesConsumed);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x1be653,(char *)0x32,0x1bd248,&local_68.m_passed,in_R9);
  doctest::String::~String(&local_68.m_decomp);
  streamToEvents_abi_cxx11_(__return_storage_ptr__,&local_90,eventFormat);
  local_90.super_EntryStream._vptr_EntryStream = (_func_int **)&PTR__TestStream_001ebca8;
  if (local_90.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> getEvents(binlog::Session& session, const char* eventFormat)
{
  TestStream stream;
  const binlog::Session::ConsumeResult cr = session.consume(stream);
  CHECK(stream.buffer.size() == cr.bytesConsumed);
  return streamToEvents(stream, eventFormat);
}